

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

void __thiscall Database::collect_stale_iterators(Database *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  *this_00;
  pointer pbVar1;
  Database *this_01;
  bool bVar2;
  uint64_t uVar3;
  time_t tVar4;
  _Base_ptr p_Var5;
  mapped_type *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *itername;
  pointer __k;
  __node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  pVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iterator_drop_list;
  IteratorLock lock;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  Database *local_a8;
  long *local_a0;
  long local_98;
  long local_90 [2];
  _Rb_tree_node_base *local_80;
  __node_base *local_78;
  _Rb_tree_node_base *local_70;
  undefined1 local_68 [32];
  __index_type local_48;
  
  ConfigKey::iterator_gc_seconds();
  uVar3 = DatabaseConfig::get(&this->config_,(ConfigKey *)local_68);
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if (uVar3 != 0) {
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tVar4 = time((time_t *)0x0);
    p_Var5 = (this->iterators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var7 = &(this->iterators)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a8 = this;
    if (p_Var5 != p_Var7) {
      local_78 = &(this->tasks)._M_h._M_before_begin;
      local_80 = p_Var7;
      do {
        if (uVar3 < (ulong)(tVar4 - (long)p_Var5[0xc]._M_right)) {
          local_a0 = local_90;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,*(long *)(p_Var5 + 1),
                     (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
          local_68._0_8_ = local_68 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_68,local_a0,local_98 + (long)local_a0);
          local_70 = p_Var5 + 1;
          local_48 = '\x01';
          p_Var6 = local_78;
          do {
            p_Var6 = p_Var6->_M_nxt;
            if (p_Var6 == (__node_base *)0x0) {
              std::__detail::__variant::_Variant_storage<false,_DatasetLock,_IteratorLock>::
              ~_Variant_storage((_Variant_storage<false,_DatasetLock,_IteratorLock> *)local_68);
              goto LAB_0012c135;
            }
            bVar2 = TaskSpec::has_lock(*(TaskSpec **)
                                        &((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor,
                                       (DatabaseLock *)local_68);
          } while (!bVar2);
          std::__detail::__variant::_Variant_storage<false,_DatasetLock,_IteratorLock>::
          ~_Variant_storage((_Variant_storage<false,_DatasetLock,_IteratorLock> *)local_68);
          if (p_Var6 == (__node_base *)0x0) {
LAB_0012c135:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_c8,(value_type *)local_70);
          }
          p_Var7 = local_80;
          if (local_a0 != local_90) {
            operator_delete(local_a0,local_90[0] + 1);
            p_Var7 = local_80;
          }
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != p_Var7);
    }
    this_01 = local_a8;
    pbVar1 = local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = &local_a8->iterators;
      __k = local_c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        this_02 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
                  ::at(this_00,__k);
        OnDiskIterator::drop(this_02);
        pVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
                ::equal_range(&this_00->_M_t,__k);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar8.first._M_node,(_Base_ptr)pVar8.second._M_node
                      );
        __k = __k + 1;
      } while (__k != pbVar1);
    }
    if (local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      save(this_01);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
  }
  return;
}

Assistant:

void Database::collect_stale_iterators() {
    uint64_t iterator_gc_seconds =
        config_.get(ConfigKey::iterator_gc_seconds());
    if (iterator_gc_seconds == 0) {
        // Zero means that GC is disabled.
        return;
    }

    std::vector<std::string> iterator_drop_list;
    std::time_t now = std::time(nullptr);
    for (const auto &[itername, iter] : iterators) {
        if (now - iter.get_last_read_time() > iterator_gc_seconds) {
            auto lock = IteratorLock(itername);
            if (can_acquire(lock)) {
                // Iterator is not locked, so it's unused, so we can free it.
                // Yes, in theory this is a race condition. But we can't acquire
                // a new lock here since we don't know the task, and chance of
                // this happening is extremely slim (iterator would have to be
                // used in exactly right millisecond after days of inactivity).
                iterator_drop_list.push_back(itername);
            }
        }
    }

    for (const auto &itername : iterator_drop_list) {
        iterators.at(itername).drop();
        iterators.erase(itername);
    }

    if (!iterator_drop_list.empty()) {
        save();
    }
}